

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testEncoding.cxx
# Opt level: O3

int testEncoding(int param_1,char **param_2)

{
  char *__s;
  pointer pcVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  ostream *poVar7;
  wchar_t *pwVar8;
  char **ppcVar9;
  long *plVar10;
  undefined8 *puVar11;
  size_type *psVar12;
  ulong *puVar13;
  size_type *psVar14;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *cstr_00;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  wchar_t *extraout_RDX_05;
  wchar_t *extraout_RDX_06;
  wchar_t *extraout_RDX_07;
  wchar_t *extraout_RDX_08;
  undefined8 uVar15;
  size_type sVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  int i;
  uchar (*__s_00) [32];
  pointer str_00;
  string str;
  wstring wstr;
  char cstr [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strings;
  wstring local_e0;
  wstring local_c0;
  string local_a0;
  uint local_7c;
  char *local_78 [2];
  char local_68;
  undefined1 uStack_67;
  undefined2 uStack_66;
  uint uStack_64;
  uint local_50;
  uint local_4c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pcVar5 = setlocale(6,"");
  if (pcVar5 == (char *)0x0) {
    pcVar5 = "Locale: None";
    sVar6 = 0xc;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Locale: ",8);
    sVar6 = strlen(pcVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  local_50 = 0;
  lVar17 = 8;
  __s_00 = helloWorldStrings;
  do {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    sVar6 = strlen((char *)__s_00);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,__s_00,*__s_00 + sVar6);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_e0._M_dataplus._M_p,
                        local_e0._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    cmsys::Encoding::ToWide(&local_c0,(string *)&local_e0);
    cmsys::Encoding::ToNarrow(&local_a0,&local_c0);
    pwVar8 = cmsysEncoding_DupToWide((char *)local_e0._M_dataplus._M_p);
    pcVar5 = cmsysEncoding_DupToNarrow(pwVar8);
    _Var2._M_p = local_e0._M_dataplus._M_p;
    if ((local_c0._M_string_length != 0) &&
       ((local_e0._M_string_length != local_a0._M_string_length ||
        (((local_e0._M_string_length != 0 &&
          (iVar4 = bcmp(local_e0._M_dataplus._M_p,local_a0._M_dataplus._M_p,
                        local_e0._M_string_length), iVar4 != 0)) ||
         (iVar4 = strcmp(pcVar5,(char *)_Var2._M_p), iVar4 != 0)))))) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"converted string was different: ",0x20);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_a0._M_dataplus._M_p,local_a0._M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"converted string was different: ",0x20);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x14d450);
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
      local_50 = local_50 + 1;
    }
    free(pwVar8);
    free(pcVar5);
    pcVar5 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      pcVar5 = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity * 4 + 4);
      pcVar5 = extraout_RDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      pcVar5 = extraout_RDX_02;
    }
    __s_00 = __s_00 + 1;
    lVar17 = lVar17 + -1;
  } while (lVar17 != 0);
  local_78[0] = (char *)CONCAT62(local_78[0]._2_6_,0xff);
  cmsys::Encoding::ToWide_abi_cxx11_(&local_e0,(Encoding *)local_78,pcVar5);
  cmsys::Encoding::ToWide_abi_cxx11_(&local_c0,(Encoding *)0x0,cstr_00);
  std::__cxx11::wstring::operator=((wstring *)&local_e0,(wstring *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity * 4 + 4);
  }
  iVar4 = std::__cxx11::wstring::compare((wchar_t *)&local_e0);
  _Var2._M_p = local_e0._M_dataplus._M_p;
  if (iVar4 == 0) {
    local_7c = 0;
    pcVar5 = extraout_RDX_03;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ToWide(NULL) returned",0x15);
    if (local_e0._M_string_length != 0) {
      uVar18 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
        std::ostream::operator<<((ostream *)&std::cout,_Var2._M_p[uVar18]);
        uVar18 = uVar18 + 1;
      } while (uVar18 < local_e0._M_string_length);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    local_7c = 1;
    std::ostream::flush();
    pcVar5 = extraout_RDX_04;
  }
  cmsys::Encoding::ToWide_abi_cxx11_(&local_c0,(Encoding *)"",pcVar5);
  std::__cxx11::wstring::operator=((wstring *)&local_e0,(wstring *)&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity * 4 + 4);
  }
  iVar4 = std::__cxx11::wstring::compare((wchar_t *)&local_e0);
  _Var2._M_p = local_e0._M_dataplus._M_p;
  pwVar8 = extraout_RDX_05;
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ToWide(\"\") returned",0x13);
    if (local_e0._M_string_length != 0) {
      uVar18 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
        *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
        std::ostream::operator<<((ostream *)&std::cout,_Var2._M_p[uVar18]);
        uVar18 = uVar18 + 1;
      } while (uVar18 < local_e0._M_string_length);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    local_7c = local_7c + 1;
    pwVar8 = extraout_RDX_06;
  }
  cmsys::Encoding::ToNarrow_abi_cxx11_((string *)&local_c0,(Encoding *)0x0,pwVar8);
  iVar4 = std::__cxx11::string::compare((char *)&local_c0);
  pwVar8 = extraout_RDX_07;
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ToNarrow(NULL) returned ",0x18);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_c0._M_dataplus._M_p,
                        local_c0._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    local_7c = local_7c + 1;
    pwVar8 = extraout_RDX_08;
  }
  cmsys::Encoding::ToNarrow_abi_cxx11_(&local_a0,(Encoding *)L"",pwVar8);
  std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  iVar4 = std::__cxx11::wstring::compare((wchar_t *)&local_e0);
  if (iVar4 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ToNarrow(\"\") returned ",0x16);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_c0._M_dataplus._M_p,
                        local_c0._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    local_7c = local_7c + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity * 4 + 4);
  }
  local_78[0] = "./app.exe";
  local_78[1] = (char *)0x13e360;
  cmsys::Encoding::CommandLineArguments::CommandLineArguments
            ((CommandLineArguments *)&local_e0,2,local_78);
  cmsys::Encoding::CommandLineArguments::CommandLineArguments
            ((CommandLineArguments *)&local_c0,(CommandLineArguments *)&local_e0);
  ppcVar9 = cmsys::Encoding::CommandLineArguments::argv((CommandLineArguments *)&local_e0);
  local_4c = 0;
  for (lVar17 = 0;
      iVar4 = cmsys::Encoding::CommandLineArguments::argc((CommandLineArguments *)&local_e0),
      lVar17 < iVar4; lVar17 = lVar17 + 1) {
    pcVar5 = ppcVar9[lVar17];
    iVar4 = strcmp(local_78[lVar17],pcVar5);
    if (iVar4 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"argv[",5);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] ",2);
      __s = local_78[lVar17];
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(*(long *)poVar7 + -0x18) + (int)poVar7);
      }
      else {
        sVar6 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,__s,sVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," != ",4);
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar5,sVar6);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      local_4c = local_4c + 1;
    }
  }
  cmsys::Encoding::CommandLineArguments::Main((CommandLineArguments *)&local_a0,2,local_78);
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments((CommandLineArguments *)&local_a0);
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments((CommandLineArguments *)&local_c0);
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments((CommandLineArguments *)&local_e0);
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 2;
  local_a0.field_2._M_allocated_capacity._0_3_ = 0x6261;
  plVar10 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_a0,2,0,'\x01');
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar12) {
    local_c0.field_2._M_allocated_capacity = *psVar12;
    local_c0.field_2._8_8_ = plVar10[3];
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar12;
    local_c0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_c0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_replace_aux
                              ((ulong)&local_c0,local_c0._M_string_length,0,'\x01');
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar12) {
    local_e0.field_2._M_allocated_capacity = *psVar12;
    local_e0.field_2._8_8_ = plVar10[3];
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar12;
    local_e0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_e0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_68 = 'd';
  uStack_67 = 0;
  local_78[1] = (char *)0x1;
  local_78[0] = &local_68;
  plVar10 = (long *)std::__cxx11::string::_M_replace_aux((ulong)local_78,1,0,'\x01');
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  puVar13 = (ulong *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_a0.field_2._M_allocated_capacity = *puVar13;
    local_a0.field_2._8_8_ = plVar10[3];
  }
  else {
    local_a0.field_2._M_allocated_capacity = *puVar13;
    local_a0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_a0._M_string_length = plVar10[1];
  *plVar10 = (long)puVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_replace_aux
                              ((ulong)&local_a0,local_a0._M_string_length,0,'\x01');
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar12) {
    local_c0.field_2._M_allocated_capacity = *psVar12;
    local_c0.field_2._8_8_ = plVar10[3];
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar12;
    local_c0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_c0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_replace_aux
                              ((ulong)&local_c0,local_c0._M_string_length,0,'\x01');
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar12) {
    local_e0.field_2._M_allocated_capacity = *psVar12;
    local_e0.field_2._8_8_ = plVar10[3];
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar12;
    local_e0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_e0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] != &local_68) {
    operator_delete(local_78[0],
                    CONCAT44(uStack_64,CONCAT22(uStack_66,CONCAT11(uStack_67,local_68))) + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_allocated_capacity =
       local_a0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  plVar10 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_a0,0,0,'\x01');
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar12) {
    local_c0.field_2._M_allocated_capacity = *psVar12;
    local_c0.field_2._8_8_ = plVar10[3];
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar12;
    local_c0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_c0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_replace_aux
                              ((ulong)&local_c0,local_c0._M_string_length,0,'\x01');
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar12) {
    local_e0.field_2._M_allocated_capacity = *psVar12;
    local_e0.field_2._8_8_ = plVar10[3];
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar12;
    local_e0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_e0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_78[1] = (char *)0x0;
  local_68 = '\0';
  local_78[0] = &local_68;
  plVar10 = (long *)std::__cxx11::string::_M_replace_aux((ulong)local_78,0,0,'\x01');
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  psVar14 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_a0.field_2._M_allocated_capacity = *psVar14;
    local_a0.field_2._8_8_ = plVar10[3];
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar14;
    local_a0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_a0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_replace_aux
                              ((ulong)&local_a0,local_a0._M_string_length,0,'\x01');
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar12) {
    local_c0.field_2._M_allocated_capacity = *psVar12;
    local_c0.field_2._8_8_ = plVar10[3];
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar12;
    local_c0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_c0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_c0);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar12) {
    local_e0.field_2._M_allocated_capacity = *psVar12;
    local_e0.field_2._8_8_ = plVar10[3];
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar12;
    local_e0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_e0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] != &local_68) {
    operator_delete(local_78[0],
                    CONCAT44(uStack_64,CONCAT22(uStack_66,CONCAT11(uStack_67,local_68))) + 1);
  }
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 2;
  local_c0.field_2._M_local_buf[0]._0_3_ = 0x6a69;
  plVar10 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_c0,2,0,'\x01');
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar12) {
    local_e0.field_2._M_allocated_capacity = *psVar12;
    local_e0.field_2._8_8_ = plVar10[3];
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar12;
    local_e0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_e0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0.field_2._M_allocated_capacity._0_2_ = 0x6b;
  local_a0._M_string_length = 1;
  plVar10 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_a0,1,0,'\x01');
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar12) {
    local_c0.field_2._M_allocated_capacity = *psVar12;
    local_c0.field_2._8_8_ = plVar10[3];
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar12;
    local_c0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_c0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::_M_replace_aux
                              ((ulong)&local_c0,local_c0._M_string_length,0,'\x01');
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  psVar12 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar12) {
    local_e0.field_2._M_allocated_capacity = *psVar12;
    local_e0.field_2._8_8_ = plVar10[3];
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar12;
    local_e0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_e0._M_string_length = plVar10[1];
  *plVar10 = (long)psVar12;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 4;
  local_a0.field_2._M_allocated_capacity =
       local_a0.field_2._M_allocated_capacity & 0xffffff0000000000;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_a0);
  puVar13 = (ulong *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)puVar13) {
    local_c0.field_2._M_allocated_capacity = *puVar13;
    local_c0.field_2._8_8_ = plVar10[3];
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *puVar13;
    local_c0._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_c0._M_string_length = plVar10[1];
  *plVar10 = (long)puVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  local_68 = '\0';
  uStack_67 = 0;
  uStack_66 = 0;
  local_78[1] = (char *)0x4;
  uStack_64 = uStack_64 & 0xffffff00;
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    uVar15 = local_c0.field_2._M_allocated_capacity;
  }
  if ((local_c0._M_string_length + 4 < 0x10) && ((ulong)uVar15 < local_c0._M_string_length + 4)) {
    local_78[0] = &local_68;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)local_78,0,(char *)0x0,(ulong)local_c0._M_dataplus._M_p);
  }
  else {
    local_78[0] = &local_68;
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c0,(ulong)&local_68);
  }
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  psVar12 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)psVar12) {
    local_e0.field_2._M_allocated_capacity = *psVar12;
    local_e0.field_2._8_8_ = puVar11[3];
  }
  else {
    local_e0.field_2._M_allocated_capacity = *psVar12;
    local_e0._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_e0._M_string_length = puVar11[1];
  *puVar11 = psVar12;
  puVar11[1] = 0;
  *(undefined1 *)psVar12 = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] != &local_68) {
    operator_delete(local_78[0],
                    CONCAT44(uStack_64,CONCAT22(uStack_66,CONCAT11(uStack_67,local_68))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar19 = 0;
  }
  else {
    uVar19 = 0;
    str_00 = local_48.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      cmsys::Encoding::ToWide(&local_e0,str_00);
      cmsys::Encoding::ToNarrow((string *)&local_c0,&local_e0);
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      pcVar1 = (str_00->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,pcVar1,pcVar1 + str_00->_M_string_length);
      if (local_a0._M_string_length != 0) {
        sVar16 = 0;
        do {
          if (local_a0._M_dataplus._M_p[sVar16] == '\0') {
            local_a0._M_dataplus._M_p[sVar16] = ' ';
          }
          sVar16 = sVar16 + 1;
        } while (local_a0._M_string_length != sVar16);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\'",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_a0._M_dataplus._M_p,local_a0._M_string_length)
      ;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' (",3);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      sVar3 = local_c0._M_string_length;
      _Var2._M_p = local_c0._M_dataplus._M_p;
      if (local_c0._M_string_length == str_00->_M_string_length) {
        if ((local_c0._M_string_length != 0) &&
           (iVar4 = bcmp(local_c0._M_dataplus._M_p,(str_00->_M_dataplus)._M_p,
                         local_c0._M_string_length), iVar4 != 0)) {
LAB_00122945:
          sVar6 = 0;
          do {
            if (*(char *)((long)_Var2._M_p + sVar6) == '\0') {
              *(undefined1 *)((long)_Var2._M_p + sVar6) = 0x20;
            }
            sVar6 = sVar6 + 1;
          } while (sVar3 != sVar6);
          goto LAB_0012295b;
        }
      }
      else {
        if (local_c0._M_string_length != 0) goto LAB_00122945;
LAB_0012295b:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"string with null was different: \'",0x21);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_c0._M_dataplus._M_p,
                            local_c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\' (",3);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        uVar19 = uVar19 + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity * 4 + 4);
      }
      str_00 = str_00 + 1;
    } while (str_00 != local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return local_7c | local_50 | uVar19 | local_4c;
}

Assistant:

int testEncoding(int, char* [])
{
  const char* loc = setlocale(LC_ALL, "");
  if (loc) {
    std::cout << "Locale: " << loc << std::endl;
  } else {
    std::cout << "Locale: None" << std::endl;
  }

  int ret = 0;

  ret |= testHelloWorldEncoding();
  ret |= testRobustEncoding();
  ret |= testCommandLineArguments();
  ret |= testWithNulls();
  ret |= testToWindowsExtendedPath();

  return ret;
}